

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyCut.c
# Opt level: O2

int Ivy_NodeCutFindOrAdd(Ivy_Store_t *pCutStore,Ivy_Cut_t *pCutNew)

{
  Ivy_Cut_t *pIVar1;
  short sVar2;
  uint uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  int iVar6;
  short sVar7;
  ulong uVar8;
  ulong uVar9;
  int *piVar10;
  ulong uVar11;
  ulong uVar12;
  
  if (pCutNew->uHash == 0) {
    __assert_fail("pCutNew->uHash",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyCut.c"
                  ,0x2ac,"int Ivy_NodeCutFindOrAdd(Ivy_Store_t *, Ivy_Cut_t *)");
  }
  uVar3 = pCutStore->nCuts;
  uVar8 = 0;
  uVar9 = 0;
  if (0 < (int)uVar3) {
    uVar9 = (ulong)uVar3;
  }
  piVar10 = pCutStore->pCuts[0].pArray;
  do {
    if (uVar8 == uVar9) {
      if ((int)uVar3 < pCutStore->nCutsMax) {
        pCutStore->nCuts = uVar3 + 1;
        pCutStore->pCuts[(int)uVar3].uHash = pCutNew->uHash;
        iVar6 = pCutNew->nLatches;
        sVar2 = pCutNew->nSize;
        sVar7 = pCutNew->nSizeMax;
        uVar4 = *(undefined8 *)pCutNew->pArray;
        uVar5 = *(undefined8 *)(pCutNew->pArray + 4);
        piVar10 = pCutStore->pCuts[(int)uVar3].pArray;
        *(undefined8 *)(piVar10 + 2) = *(undefined8 *)(pCutNew->pArray + 2);
        *(undefined8 *)(piVar10 + 4) = uVar5;
        pIVar1 = pCutStore->pCuts + (int)uVar3;
        pIVar1->nLatches = iVar6;
        pIVar1->nSize = sVar2;
        pIVar1->nSizeMax = sVar7;
        *(undefined8 *)pIVar1->pArray = uVar4;
        return 0;
      }
      __assert_fail("pCutStore->nCuts < pCutStore->nCutsMax",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyCut.c"
                    ,0x2ba,"int Ivy_NodeCutFindOrAdd(Ivy_Store_t *, Ivy_Cut_t *)");
    }
    if (pCutStore->pCuts[uVar8].uHash == pCutNew->uHash) {
      sVar2 = pCutStore->pCuts[uVar8].nSize;
      if (sVar2 == pCutNew->nSize) {
        uVar11 = 0;
        if (0 < sVar2) {
          uVar11 = (ulong)(uint)(int)sVar2;
        }
        for (uVar12 = 0; uVar11 != uVar12; uVar12 = uVar12 + 1) {
          if (piVar10[uVar12] != pCutNew->pArray[uVar12]) {
            uVar11 = uVar12 & 0xffffffff;
            break;
          }
        }
        if ((uint)uVar11 == (int)sVar2) {
          return 1;
        }
      }
    }
    uVar8 = uVar8 + 1;
    piVar10 = piVar10 + 9;
  } while( true );
}

Assistant:

int Ivy_NodeCutFindOrAdd( Ivy_Store_t * pCutStore, Ivy_Cut_t * pCutNew )
{
    Ivy_Cut_t * pCut;
    int i, k;
    assert( pCutNew->uHash );
    // try to find the cut
    for ( i = 0; i < pCutStore->nCuts; i++ )
    {
        pCut = pCutStore->pCuts + i;
        if ( pCut->uHash == pCutNew->uHash && pCut->nSize == pCutNew->nSize )
        {
            for ( k = 0; k < pCutNew->nSize; k++ )
                if ( pCut->pArray[k] != pCutNew->pArray[k] )
                    break;
            if ( k == pCutNew->nSize )
                return 1;
        }
    }
    assert( pCutStore->nCuts < pCutStore->nCutsMax );
    // add the cut
    pCut = pCutStore->pCuts + pCutStore->nCuts++;
    *pCut = *pCutNew;
    return 0;
}